

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void anon_unknown.dwarf_1335b8::readWholeFiles(int modification)

{
  float fVar1;
  char *pcVar2;
  bool bVar3;
  char cVar4;
  __type _Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Box<Imath_3_2::Vec2<int>_> *pBVar13;
  Box<Imath_3_2::Vec2<int>_> *pBVar14;
  float *pfVar15;
  float *pfVar16;
  int *piVar17;
  ChannelList *this;
  ChannelList *pCVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  ostream *poVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  DeepScanLineInputPart part_1;
  Array2D<unsigned_int> sampleCount;
  Array2D<Imath_3_2::half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  MultiPartInputFile file;
  vector<int,_std::allocator<int>_> shuffledPartNumber;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  FrameBuffer frameBuffer;
  InputPart part;
  
  pcVar2 = (anonymous_namespace)::filename_abi_cxx11_;
  uData._sizeX = 0;
  uData._sizeY = 0;
  uData._data = (uint *)0x0;
  fData._sizeX = 0;
  fData._sizeY = 0;
  fData._data = (float *)0x0;
  hData._sizeX = 0;
  hData._sizeY = 0;
  hData._data = (half *)0x0;
  deepUData._sizeX = 0;
  deepUData._sizeY = 0;
  deepUData._data = (uint **)0x0;
  deepFData._sizeX = 0;
  deepFData._sizeY = 0;
  deepFData._data = (float **)0x0;
  deepHData._sizeX = 0;
  deepHData._sizeY = 0;
  deepHData._data = (half **)0x0;
  sampleCount._sizeX = 0;
  sampleCount._sizeY = 0;
  sampleCount._data = (uint *)0x0;
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(&file,pcVar2,iVar6,true);
  lVar26 = 0;
  while( true ) {
    iVar6 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar6 <= lVar26) {
      std::operator<<((ostream *)&std::cout,"Reading whole files ");
      std::ostream::flush();
      shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (frameBuffer._map._M_t._M_impl._0_4_ = ZEXT14(0 < modification);
          (int)frameBuffer._map._M_t._M_impl._0_4_ <
          (int)((DAT_001d7788 - (anonymous_namespace)::headers) / 0x38);
          frameBuffer._map._M_t._M_impl._0_4_ = frameBuffer._map._M_t._M_impl._0_4_ + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&shuffledPartNumber,(value_type_conflict3 *)&frameBuffer);
      }
      for (uVar24 = 0;
          uVar22 = (long)shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2, uVar24 < uVar22; uVar24 = uVar24 + 1
          ) {
        iVar7 = random_int((int)uVar22);
        iVar8 = random_int((int)((ulong)((long)shuffledPartNumber.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)shuffledPartNumber.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start) >> 2));
        iVar6 = shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7];
        shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar7] =
             shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar8];
        shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar8] = iVar6;
      }
      uVar24 = 0;
      do {
        if ((ulong)((long)shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar24) {
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>);
          Imf_3_2::MultiPartInputFile::~MultiPartInputFile(&file);
          Imf_3_2::Array2D<unsigned_int>::~Array2D(&sampleCount);
          Imf_3_2::Array2D<Imath_3_2::half_*>::~Array2D(&deepHData);
          Imf_3_2::Array2D<float_*>::~Array2D(&deepFData);
          Imf_3_2::Array2D<unsigned_int_*>::~Array2D(&deepUData);
          Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&hData);
          Imf_3_2::Array2D<float>::~Array2D(&fData);
          Imf_3_2::Array2D<unsigned_int>::~Array2D(&uData);
          return;
        }
        iVar6 = shuffledPartNumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar24];
        lVar26 = (long)iVar6;
        switch(*(undefined4 *)((anonymous_namespace)::partTypes + lVar26 * 4)) {
        case 0:
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          setInputFrameBuffer(&frameBuffer,*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),
                              &uData,&fData,&hData,0x10,0x10);
          Imf_3_2::InputPart::InputPart(&part,&file,iVar6);
          Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&part);
          Imf_3_2::InputPart::readPixels((int)&part,0);
          iVar7 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
          if (iVar7 == 0) {
            bVar3 = checkPixels<unsigned_int>(&uData,0x10,0x10);
            if (!bVar3) {
              __assert_fail("checkPixels<unsigned int> ( uData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x36d,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar7 == 1) {
            bVar3 = checkPixels<float>(&fData,0x10,0x10);
            if (!bVar3) {
              __assert_fail("checkPixels<float> (fData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x370,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar7 == 2) && (bVar3 = checkPixels<Imath_3_2::half>(&hData,0x10,0x10), !bVar3))
          {
            __assert_fail("checkPixels<half> (hData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                          ,0x373,"void (anonymous namespace)::readWholeFiles(int)");
          }
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                       *)&frameBuffer);
          break;
        case 1:
          Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)&part,&file,iVar6);
          iVar8 = Imf_3_2::TiledInputPart::numXLevels();
          iVar7 = Imf_3_2::TiledInputPart::numYLevels();
          iVar25 = 0;
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          for (; iVar25 != iVar8; iVar25 = iVar25 + 1) {
            for (iVar23 = 0; iVar7 != iVar23; iVar23 = iVar23 + 1) {
              cVar4 = Imf_3_2::TiledInputPart::isValidLevel((int)&part,iVar25);
              if (cVar4 != '\0') {
                iVar9 = Imf_3_2::TiledInputPart::levelWidth((int)&part);
                iVar10 = Imf_3_2::TiledInputPart::levelHeight((int)&part);
                frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)0x0;
                frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
                frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                setInputFrameBuffer(&frameBuffer,
                                    *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&uData,
                                    &fData,&hData,iVar9,iVar10);
                Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)&part);
                iVar12 = (int)&part;
                iVar11 = Imf_3_2::TiledInputPart::numXTiles(iVar12);
                iVar12 = Imf_3_2::TiledInputPart::numYTiles(iVar12);
                Imf_3_2::TiledInputPart::readTiles((int)&part,0,iVar11 + -1,0,iVar12 + -1,iVar25);
                iVar11 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
                if (iVar11 == 0) {
                  bVar3 = checkPixels<unsigned_int>(&uData,iVar9,iVar10);
                  if (!bVar3) {
                    __assert_fail("checkPixels<unsigned int> ( uData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                  ,0x39c,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if (iVar11 == 1) {
                  bVar3 = checkPixels<float>(&fData,iVar9,iVar10);
                  if (!bVar3) {
                    __assert_fail("checkPixels<float> (fData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                  ,0x39f,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if ((iVar11 == 2) &&
                        (bVar3 = checkPixels<Imath_3_2::half>(&hData,iVar9,iVar10), !bVar3)) {
                  __assert_fail("checkPixels<half> (hData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                ,0x3a2,"void (anonymous namespace)::readWholeFiles(int)");
                }
                std::
                _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                             *)&frameBuffer);
              }
            }
          }
          break;
        case 2:
          Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart(&part_1,&file,iVar6);
          Imf_3_2::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&frameBuffer);
          Imf_3_2::Array2D<unsigned_int>::resizeErase(&sampleCount,0x10,0x10);
          Imf_3_2::Slice::Slice
                    ((Slice *)&part,UINT,(char *)sampleCount._data,4,0x40,1,1,0.0,false,false);
          Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
          setInputDeepFrameBuffer
                    ((DeepFrameBuffer *)&frameBuffer,
                     *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&deepUData,&deepFData,
                     &deepHData,0x10,0x10);
          Imf_3_2::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)&part_1);
          Imf_3_2::DeepScanLineInputPart::readPixelSampleCounts((int)&part_1,0);
          allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&sampleCount,
                         &deepUData,&deepFData,&deepHData,0x10,0x10);
          Imf_3_2::DeepScanLineInputPart::readPixels((int)&part_1,0);
          iVar7 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
          if (iVar7 == 0) {
            bVar3 = checkPixels<unsigned_int>(&sampleCount,&deepUData,0x10,0x10);
            if (!bVar3) {
              __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x3cf,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if (iVar7 == 1) {
            bVar3 = checkPixels<float>(&sampleCount,&deepFData,0x10,0x10);
            if (!bVar3) {
              __assert_fail("checkPixels<float> ( sampleCount, deepFData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                            ,0x3d3,"void (anonymous namespace)::readWholeFiles(int)");
            }
          }
          else if ((iVar7 == 2) &&
                  (bVar3 = checkPixels<Imath_3_2::half>(&sampleCount,&deepHData,0x10,0x10), !bVar3))
          {
            __assert_fail("checkPixels<half> ( sampleCount, deepHData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                          ,0x3d7,"void (anonymous namespace)::readWholeFiles(int)");
          }
          releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&deepUData,
                        &deepFData,&deepHData,0x10,0x10);
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                       *)&frameBuffer);
          break;
        case 3:
          Imf_3_2::DeepTiledInputPart::DeepTiledInputPart((DeepTiledInputPart *)&part_1,&file,iVar6)
          ;
          iVar8 = Imf_3_2::DeepTiledInputPart::numXLevels();
          iVar7 = Imf_3_2::DeepTiledInputPart::numYLevels();
          iVar25 = 0;
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          if (iVar8 < 1) {
            iVar8 = 0;
          }
          for (; iVar25 != iVar8; iVar25 = iVar25 + 1) {
            for (iVar23 = 0; iVar7 != iVar23; iVar23 = iVar23 + 1) {
              iVar11 = (int)&part_1;
              cVar4 = Imf_3_2::DeepTiledInputPart::isValidLevel(iVar11,iVar25);
              if (cVar4 != '\0') {
                iVar9 = Imf_3_2::DeepTiledInputPart::levelWidth(iVar11);
                iVar10 = Imf_3_2::DeepTiledInputPart::levelHeight(iVar11);
                Imf_3_2::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&frameBuffer);
                Imf_3_2::Array2D<unsigned_int>::resizeErase(&sampleCount,(long)iVar10,(long)iVar9);
                Imf_3_2::Slice::Slice
                          ((Slice *)&part,UINT,(char *)sampleCount._data,4,(long)iVar9 << 2,1,1,0.0,
                           false,false);
                Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
                setInputDeepFrameBuffer
                          ((DeepFrameBuffer *)&frameBuffer,
                           *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&deepUData,
                           &deepFData,&deepHData,iVar9,iVar10);
                Imf_3_2::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)&part_1);
                iVar12 = (int)(DeepFrameBuffer *)&part_1;
                iVar11 = Imf_3_2::DeepTiledInputPart::numXTiles(iVar12);
                iVar12 = Imf_3_2::DeepTiledInputPart::numYTiles(iVar12);
                Imf_3_2::DeepTiledInputPart::readPixelSampleCounts
                          ((int)&part_1,0,iVar11 + -1,0,iVar12 + -1,iVar25);
                allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&sampleCount
                               ,&deepUData,&deepFData,&deepHData,iVar9,iVar10);
                Imf_3_2::DeepTiledInputPart::readTiles
                          ((int)&part_1,0,iVar11 + -1,0,iVar12 + -1,iVar25);
                iVar11 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
                if (iVar11 == 0) {
                  bVar3 = checkPixels<unsigned_int>(&sampleCount,&deepUData,iVar9,iVar10);
                  if (!bVar3) {
                    __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                  ,0x424,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if (iVar11 == 1) {
                  bVar3 = checkPixels<float>(&sampleCount,&deepFData,iVar9,iVar10);
                  if (!bVar3) {
                    __assert_fail("checkPixels<float> ( sampleCount, deepFData, w, h)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                  ,0x428,"void (anonymous namespace)::readWholeFiles(int)");
                  }
                }
                else if ((iVar11 == 2) &&
                        (bVar3 = checkPixels<Imath_3_2::half>(&sampleCount,&deepHData,iVar9,iVar10),
                        !bVar3)) {
                  __assert_fail("checkPixels<half> ( sampleCount, deepHData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                                ,0x42c,"void (anonymous namespace)::readWholeFiles(int)");
                }
                releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&deepUData,
                              &deepFData,&deepHData,iVar9,iVar10);
                std::
                _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                             *)&frameBuffer);
              }
            }
          }
        }
        poVar21 = std::operator<<((ostream *)&std::cerr,"part ");
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,iVar6);
        std::operator<<(poVar21," ok ");
        uVar24 = uVar24 + 1;
      } while( true );
    }
    Imf_3_2::MultiPartInputFile::header((int)&file);
    pBVar13 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
    bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar13,pBVar14);
    if (!bVar3) {
      __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32b,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pBVar13 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar13,pBVar14);
    if (!bVar3) {
      __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32c,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar15 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar1 = *pfVar15;
    pfVar15 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar15) || (NAN(fVar1) || NAN(*pfVar15))) {
      __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x32d,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar15 = (float *)Imf_3_2::Header::screenWindowCenter();
    pfVar16 = (float *)Imf_3_2::Header::screenWindowCenter();
    if ((((*pfVar15 != *pfVar16) || (NAN(*pfVar15) || NAN(*pfVar16))) || (pfVar15[1] != pfVar16[1]))
       || (NAN(pfVar15[1]) || NAN(pfVar16[1]))) break;
    pfVar15 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar1 = *pfVar15;
    pfVar15 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar1 != *pfVar15) || (NAN(fVar1) || NAN(*pfVar15))) {
      __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x330,"void (anonymous namespace)::readWholeFiles(int)");
    }
    piVar17 = (int *)Imf_3_2::Header::lineOrder();
    iVar6 = *piVar17;
    piVar17 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar6 != *piVar17) {
      __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x331,"void (anonymous namespace)::readWholeFiles(int)");
    }
    piVar17 = (int *)Imf_3_2::Header::compression();
    iVar6 = *piVar17;
    piVar17 = (int *)Imf_3_2::Header::compression();
    if (iVar6 != *piVar17) {
      __assert_fail("header.compression () == headers[i].compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x332,"void (anonymous namespace)::readWholeFiles(int)");
    }
    this = (ChannelList *)Imf_3_2::Header::channels();
    pCVar18 = (ChannelList *)Imf_3_2::Header::channels();
    cVar4 = Imf_3_2::ChannelList::operator==(this,pCVar18);
    if (cVar4 == '\0') {
      __assert_fail("header.channels () == headers[i].channels ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x333,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Imf_3_2::Header::name_abi_cxx11_();
    pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Imf_3_2::Header::name_abi_cxx11_();
    _Var5 = std::operator==(pbVar19,pbVar20);
    if (!_Var5) {
      __assert_fail("header.name () == headers[i].name ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                    ,0x334,"void (anonymous namespace)::readWholeFiles(int)");
    }
    if (lVar26 == 0 && modification == 1) {
      pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_2::Header::type_abi_cxx11_();
      pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_2::Header::type_abi_cxx11_();
      bVar3 = std::operator!=(pbVar19,pbVar20);
      if (!bVar3) {
        __assert_fail("header.type () != headers[i].type ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                      ,0x337,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    else {
      pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_2::Header::type_abi_cxx11_();
      pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_2::Header::type_abi_cxx11_();
      _Var5 = std::operator==(pbVar19,pbVar20);
      if (!_Var5) {
        __assert_fail("header.type () == headers[i].type ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                      ,0x33b,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    lVar26 = lVar26 + 1;
  }
  __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testFutureProofing.cpp"
                ,0x32f,"void (anonymous namespace)::readWholeFiles(int)");
}

Assistant:

void
readWholeFiles (int modification)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*>        deepFData;
    Array2D<half*>         deepHData;

    Array2D<unsigned int> sampleCount;

    MultiPartInputFile file (filename.c_str ());
    for (int i = 0; i < file.parts (); i++)
    {
        const Header& header = file.header (i);
        assert (header.displayWindow () == headers[i].displayWindow ());
        assert (header.dataWindow () == headers[i].dataWindow ());
        assert (header.pixelAspectRatio () == headers[i].pixelAspectRatio ());
        assert (
            header.screenWindowCenter () == headers[i].screenWindowCenter ());
        assert (header.screenWindowWidth () == headers[i].screenWindowWidth ());
        assert (header.lineOrder () == headers[i].lineOrder ());
        assert (header.compression () == headers[i].compression ());
        assert (header.channels () == headers[i].channels ());
        assert (header.name () == headers[i].name ());
        if (modification == 1 && i == 0)
        {
            assert (header.type () != headers[i].type ());
        }
        else
        {
            assert (header.type () == headers[i].type ());
        }
    }

    cout << "Reading whole files " << flush;

    //
    // Shuffle part numbers.
    //
    vector<int> shuffledPartNumber;
    for (int i = modification > 0 ? 1 : 0;
         i < static_cast<int> (headers.size ());
         i++)
        shuffledPartNumber.push_back (i);
    for (size_t i = 0; i < shuffledPartNumber.size (); i++)
    {
        size_t a = random_int (shuffledPartNumber.size ());
        size_t b = random_int (shuffledPartNumber.size ());
        swap (shuffledPartNumber[a], shuffledPartNumber[b]);
    }

    //
    // Start reading whole files.
    //
    int partNumber;
    try
    {
        for (size_t i = 0; i < shuffledPartNumber.size (); i++)
        {
            partNumber = shuffledPartNumber[i];
            switch (partTypes[partNumber])
            {
                case 0: {
                    FrameBuffer frameBuffer;
                    setInputFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        uData,
                        fData,
                        hData,
                        width,
                        height);

                    InputPart part (file, partNumber);
                    part.setFrameBuffer (frameBuffer);
                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                uData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (fData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (hData, width, height));
                            break;
                    }
                    break;
                }
                case 1: {
                    TiledInputPart part (file, partNumber);
                    int            numXLevels = part.numXLevels ();
                    int            numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            FrameBuffer frameBuffer;
                            setInputFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                uData,
                                fData,
                                hData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);
                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);
                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        uData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (fData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (hData, w, h));
                                    break;
                            }
                        }
                    break;
                }
                case 2: {
                    DeepScanLineInputPart part (file, partNumber);

                    DeepFrameBuffer frameBuffer;

                    sampleCount.resizeErase (height, width);
                    frameBuffer.insertSampleCountSlice (Slice (
                        IMF::UINT,
                        (char*) (&sampleCount[0][0]),
                        sizeof (unsigned int) * 1,
                        sizeof (unsigned int) * width));

                    setInputDeepFrameBuffer (
                        frameBuffer,
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.setFrameBuffer (frameBuffer);

                    part.readPixelSampleCounts (0, height - 1);

                    allocatePixels (
                        pixelTypes[partNumber],
                        sampleCount,
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    part.readPixels (0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert (checkPixels<unsigned int> (
                                sampleCount, deepUData, width, height));
                            break;
                        case 1:
                            assert (checkPixels<float> (
                                sampleCount, deepFData, width, height));
                            break;
                        case 2:
                            assert (checkPixels<half> (
                                sampleCount, deepHData, width, height));
                            break;
                    }

                    releasePixels (
                        pixelTypes[partNumber],
                        deepUData,
                        deepFData,
                        deepHData,
                        width,
                        height);

                    break;
                }
                case 3: {
                    DeepTiledInputPart part (file, partNumber);
                    int                numXLevels = part.numXLevels ();
                    int                numYLevels = part.numYLevels ();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel (xLevel, yLevel)) continue;

                            int w = part.levelWidth (xLevel);
                            int h = part.levelHeight (yLevel);

                            DeepFrameBuffer frameBuffer;

                            sampleCount.resizeErase (h, w);
                            frameBuffer.insertSampleCountSlice (Slice (
                                IMF::UINT,
                                (char*) (&sampleCount[0][0]),
                                sizeof (unsigned int) * 1,
                                sizeof (unsigned int) * w));

                            setInputDeepFrameBuffer (
                                frameBuffer,
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.setFrameBuffer (frameBuffer);

                            int numXTiles = part.numXTiles (xLevel);
                            int numYTiles = part.numYTiles (yLevel);

                            part.readPixelSampleCounts (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);

                            allocatePixels (
                                pixelTypes[partNumber],
                                sampleCount,
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);

                            part.readTiles (
                                0,
                                numXTiles - 1,
                                0,
                                numYTiles - 1,
                                xLevel,
                                yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert (checkPixels<unsigned int> (
                                        sampleCount, deepUData, w, h));
                                    break;
                                case 1:
                                    assert (checkPixels<float> (
                                        sampleCount, deepFData, w, h));
                                    break;
                                case 2:
                                    assert (checkPixels<half> (
                                        sampleCount, deepHData, w, h));
                                    break;
                            }

                            releasePixels (
                                pixelTypes[partNumber],
                                deepUData,
                                deepFData,
                                deepHData,
                                w,
                                h);
                        }

                    break;
                }
            }
            cerr << "part " << partNumber << " ok ";
        }
    }
    catch (...)
    {
        cout << "Error while reading part " << partNumber << endl << flush;
        throw;
    }
}